

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddQuadFilled(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *d,ImU32 col)

{
  ImVec2 *pIVar1;
  uint uVar2;
  ImVec2 *pIVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (0xffffff < col) {
    iVar7 = (this->_Path).Size;
    iVar6 = (this->_Path).Capacity;
    if (iVar7 == iVar6) {
      iVar7 = iVar7 + 1;
      if (iVar6 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar6 / 2 + iVar6;
      }
      if (iVar7 < iVar5) {
        iVar7 = iVar5;
      }
      if (iVar6 < iVar7) {
        pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar3;
        (this->_Path).Capacity = iVar7;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *a;
    iVar6 = (this->_Path).Size;
    iVar5 = (this->_Path).Capacity;
    iVar7 = iVar6 + 1;
    (this->_Path).Size = iVar7;
    if (iVar7 == iVar5) {
      iVar6 = iVar6 + 2;
      if (iVar5 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar5 / 2 + iVar5;
      }
      if (iVar6 < iVar7) {
        iVar6 = iVar7;
      }
      if (iVar5 < iVar6) {
        pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar3;
        (this->_Path).Capacity = iVar6;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *b;
    iVar6 = (this->_Path).Size;
    iVar5 = (this->_Path).Capacity;
    iVar7 = iVar6 + 1;
    (this->_Path).Size = iVar7;
    if (iVar7 == iVar5) {
      iVar6 = iVar6 + 2;
      if (iVar5 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar5 / 2 + iVar5;
      }
      if (iVar6 < iVar7) {
        iVar6 = iVar7;
      }
      if (iVar5 < iVar6) {
        pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar3;
        (this->_Path).Capacity = iVar6;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *c;
    iVar6 = (this->_Path).Size;
    iVar5 = (this->_Path).Capacity;
    iVar7 = iVar6 + 1;
    (this->_Path).Size = iVar7;
    if (iVar7 == iVar5) {
      iVar6 = iVar6 + 2;
      if (iVar5 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar5 / 2 + iVar5;
      }
      if (iVar6 < iVar7) {
        iVar6 = iVar7;
      }
      if (iVar5 < iVar6) {
        pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
        pIVar1 = (this->_Path).Data;
        if (pIVar1 != (ImVec2 *)0x0) {
          memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar3;
        (this->_Path).Capacity = iVar6;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *d;
    iVar7 = (this->_Path).Size + 1;
    (this->_Path).Size = iVar7;
    AddConvexPolyFilled(this,(this->_Path).Data,iVar7,col);
    iVar7 = (this->_Path).Capacity;
    if (iVar7 < 0) {
      uVar4 = iVar7 / 2 + iVar7;
      uVar2 = 0;
      if (0 < (int)uVar4) {
        uVar2 = uVar4;
      }
      pIVar3 = (ImVec2 *)ImGui::MemAlloc((ulong)uVar2 * 8);
      pIVar1 = (this->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar3;
      (this->_Path).Capacity = uVar2;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddQuadFilled(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathLineTo(d);
    PathFillConvex(col);
}